

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_stages<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *info,ScratchAllocator *alloc,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,DynamicStateInfo *dynamic_state_info)

{
  bool bVar1;
  VkPipelineShaderStageCreateInfo *pVVar2;
  size_t sVar3;
  char *pcVar4;
  void *local_58;
  void *pNext;
  VkPipelineShaderStageCreateInfo *stage;
  DynamicStateInfo *pDStack_40;
  uint32_t i;
  DynamicStateInfo *dynamic_state_info_local;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii_local;
  VkDevice device_local;
  ScratchAllocator *alloc_local;
  VkGraphicsPipelineCreateInfo *info_local;
  Impl *this_local;
  
  pDStack_40 = dynamic_state_info;
  dynamic_state_info_local = (DynamicStateInfo *)gsmcii;
  gsmcii_local = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)device;
  device_local = (VkDevice)alloc;
  alloc_local = (ScratchAllocator *)info;
  info_local = (VkGraphicsPipelineCreateInfo *)this;
  pVVar2 = copy<VkPipelineShaderStageCreateInfo>(this,info->pStages,(ulong)info->stageCount,alloc);
  alloc_local[3].impl = (Impl *)pVVar2;
  stage._4_4_ = 0;
  while( true ) {
    if (*(uint *)((long)&alloc_local[2].impl + 4) <= stage._4_4_) {
      return true;
    }
    pNext = (void *)((long)alloc_local[3].impl + (ulong)stage._4_4_ * 0x30);
    if (*(long *)((long)pNext + 0x20) == 0) {
      return false;
    }
    pcVar4 = *(char **)((long)pNext + 0x20);
    sVar3 = strlen(*(char **)((long)pNext + 0x20));
    pcVar4 = copy<char>(this,pcVar4,sVar3 + 1,(ScratchAllocator *)device_local);
    *(char **)((long)pNext + 0x20) = pcVar4;
    if ((*(long *)((long)pNext + 0x28) != 0) &&
       (bVar1 = copy_specialization_info
                          (this,*(VkSpecializationInfo **)((long)pNext + 0x28),
                           (ScratchAllocator *)device_local,
                           (VkSpecializationInfo **)((long)pNext + 0x28)), !bVar1)) {
      return false;
    }
    local_58 = (void *)0x0;
    bVar1 = copy_pnext_chain(this,*(void **)((long)pNext + 8),(ScratchAllocator *)device_local,
                             &local_58,pDStack_40,0);
    if (!bVar1) {
      return false;
    }
    *(void **)((long)pNext + 8) = local_58;
    bVar1 = add_module_identifier
                      ((VkPipelineShaderStageCreateInfo *)pNext,(ScratchAllocator *)device_local,
                       (VkDevice)gsmcii_local,
                       (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)dynamic_state_info_local);
    if (!bVar1) break;
    stage._4_4_ = stage._4_4_ + 1;
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::copy_stages(CreateInfo *info, ScratchAllocator &alloc,
                                      VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                      const DynamicStateInfo *dynamic_state_info)
{
	info->pStages = copy(info->pStages, info->stageCount, alloc);
	for (uint32_t i = 0; i < info->stageCount; i++)
	{
		auto &stage = const_cast<VkPipelineShaderStageCreateInfo &>(info->pStages[i]);

		if (!stage.pName)
			return false;

		stage.pName = copy(stage.pName, strlen(stage.pName) + 1, alloc);
		if (stage.pSpecializationInfo)
			if (!copy_specialization_info(stage.pSpecializationInfo, alloc, &stage.pSpecializationInfo))
				return false;

		const void *pNext = nullptr;
		if (!copy_pnext_chain(stage.pNext, alloc, &pNext, dynamic_state_info, 0))
			return false;

		stage.pNext = pNext;

		if (!add_module_identifier(&stage, alloc, device, gsmcii))
			return false;
	}

	return true;
}